

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

tchar prvTidyCombineSurrogatePair(tchar high,tchar low)

{
  Bool BVar1;
  tchar low_local;
  tchar high_local;
  
  BVar1 = prvTidyIsHighSurrogate(high);
  if (BVar1 != no) {
    BVar1 = prvTidyIsLowSurrogate(low);
    if (BVar1 != no) {
      return (low - 0xd800) * 0x400 + high + 0x2400;
    }
  }
  __assert_fail("TY_(IsHighSurrogate)(high) && TY_(IsLowSurrogate)(low)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/utf8.c"
                ,0x1e7,"tchar prvTidyCombineSurrogatePair(tchar, tchar)");
}

Assistant:

tchar   TY_(CombineSurrogatePair)( tchar high, tchar low )
{
    assert( TY_(IsHighSurrogate)(high) && TY_(IsLowSurrogate)(low) );
    return ( ((low - kUTF16LowSurrogateBegin) * 0x400) + 
             high - kUTF16HighSurrogateBegin + 0x10000 );
}